

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O3

ngx_int_t ngx_http_charset_postconfiguration(ngx_conf_t *cf)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  
  plVar1 = *(long **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8);
  lVar2 = *plVar1;
  plVar11 = (long *)plVar1[5];
  if (plVar1[0xb] == 0) {
    if (plVar1[6] != 0) {
LAB_00160c4b:
      uVar7 = 0;
      do {
        lVar8 = *plVar11;
        pvVar4 = *(void **)(lVar2 + lVar8 * 0x20);
        if (pvVar4 == (void *)0x0) {
          pvVar4 = ngx_pcalloc(cf->pool,plVar1[1] << 3);
          if (pvVar4 == (void *)0x0) {
            return -1;
          }
          lVar8 = *plVar11;
          *(void **)(lVar2 + lVar8 * 0x20) = pvVar4;
        }
        lVar6 = plVar11[1];
        pvVar5 = *(void **)(lVar2 + lVar6 * 0x20);
        if (pvVar5 == (void *)0x0) {
          pvVar5 = ngx_pcalloc(cf->pool,plVar1[1] << 3);
          if (pvVar5 == (void *)0x0) {
            return -1;
          }
          lVar6 = plVar11[1];
          *(void **)(lVar2 + lVar6 * 0x20) = pvVar5;
          lVar8 = *plVar11;
        }
        *(long *)((long)pvVar4 + lVar6 * 8) = plVar11[2];
        *(long *)((long)pvVar5 + lVar8 * 8) = plVar11[3];
        uVar7 = uVar7 + 1;
        plVar11 = plVar11 + 4;
      } while (uVar7 < (ulong)plVar1[6]);
    }
    ngx_http_next_body_filter = ngx_http_top_body_filter;
    ngx_http_next_header_filter = ngx_http_top_header_filter;
    ngx_http_top_header_filter = ngx_http_charset_header_filter;
    ngx_http_top_body_filter = ngx_http_charset_body_filter;
    return 0;
  }
  lVar8 = 0;
LAB_00160ba3:
  lVar6 = plVar1[10] + lVar8 * 0x10;
  lVar3 = *(long *)(plVar1[10] + lVar8 * 0x10);
  lVar10 = plVar1[6];
  plVar9 = plVar11 + 1;
  do {
    if (lVar10 == 0) {
      if (cf->log->log_level == 0) {
        return -1;
      }
      ngx_log_error_core(1,cf->log,0,"no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                         lVar3 * 0x20 + lVar2 + 8,lVar2 + *(long *)(lVar6 + 8) * 0x20 + 8);
      return -1;
    }
    if (lVar3 == plVar9[-1]) {
      lVar12 = *plVar9;
      if (*(long *)(lVar6 + 8) == lVar12) break;
    }
    else {
      lVar12 = *plVar9;
    }
    if ((lVar3 == lVar12) && (*(long *)(lVar6 + 8) == plVar9[-1])) break;
    plVar9 = plVar9 + 4;
    lVar10 = lVar10 + -1;
  } while( true );
  lVar8 = lVar8 + 1;
  if (lVar8 == plVar1[0xb]) goto LAB_00160c4b;
  goto LAB_00160ba3;
}

Assistant:

static ngx_int_t
ngx_http_charset_postconfiguration(ngx_conf_t *cf)
{
    u_char                       **src, **dst;
    ngx_int_t                      c;
    ngx_uint_t                     i, t;
    ngx_http_charset_t            *charset;
    ngx_http_charset_recode_t     *recode;
    ngx_http_charset_tables_t     *tables;
    ngx_http_charset_main_conf_t  *mcf;

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    recode = mcf->recodes.elts;
    tables = mcf->tables.elts;
    charset = mcf->charsets.elts;

    for (i = 0; i < mcf->recodes.nelts; i++) {

        c = recode[i].src;

        for (t = 0; t < mcf->tables.nelts; t++) {

            if (c == tables[t].src && recode[i].dst == tables[t].dst) {
                goto next;
            }

            if (c == tables[t].dst && recode[i].dst == tables[t].src) {
                goto next;
            }
        }

        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                   "no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                   &charset[c].name, &charset[recode[i].dst].name);
        return NGX_ERROR;

    next:
        continue;
    }


    for (t = 0; t < mcf->tables.nelts; t++) {

        src = charset[tables[t].src].tables;

        if (src == NULL) {
            src = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (src == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].src].tables = src;
        }

        dst = charset[tables[t].dst].tables;

        if (dst == NULL) {
            dst = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (dst == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].dst].tables = dst;
        }

        src[tables[t].dst] = tables[t].src2dst;
        dst[tables[t].src] = tables[t].dst2src;
    }

    ngx_http_next_header_filter = ngx_http_top_header_filter;
    ngx_http_top_header_filter = ngx_http_charset_header_filter;

    ngx_http_next_body_filter = ngx_http_top_body_filter;
    ngx_http_top_body_filter = ngx_http_charset_body_filter;

    return NGX_OK;
}